

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O2

void pfx_export_cb(pfx_record *pfx_record,void *data)

{
  anon_union_16_2_f3fa3043_for_u *paVar1;
  tommy_count_t pos;
  tommy_array *array;
  tommy_hashlin *hashlin;
  uint32_t *puVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char cVar7;
  tommy_uint32_t hash;
  uint uVar8;
  undefined8 *data_00;
  void **ppvVar9;
  tommy_hashlin_node *ptVar10;
  pfx_record *arg1;
  long in_FS_OFFSET;
  uint32_t local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  uint32_t local_68;
  uint8_t local_64;
  uint8_t local_63;
  undefined8 local_58;
  undefined8 uStack_50;
  uint32_t local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  array = *data;
  hashlin = *(tommy_hashlin **)((long)data + 8);
  uStack_6c = 0;
  uStack_74 = 0;
  uStack_70 = 0;
  paVar1 = &(pfx_record->prefix).u;
  if ((pfx_record->prefix).ver == LRTR_IPV4) {
    local_78 = (paVar1->addr4).addr;
  }
  else {
    uVar4 = *(undefined8 *)paVar1;
    uVar5 = *(undefined8 *)((long)&(pfx_record->prefix).u + 8);
    local_78 = (uint32_t)uVar4;
    uStack_74 = (undefined4)((ulong)uVar4 >> 0x20);
    uStack_70 = (undefined4)uVar5;
    uStack_6c = (undefined4)((ulong)uVar5 >> 0x20);
  }
  local_68 = pfx_record->asn;
  local_64 = pfx_record->min_len;
  local_63 = pfx_record->max_len;
  hash = tommy_hash_u32(0,&local_78,0x16);
  uVar8 = hashlin->low_mask & hash;
  if (uVar8 < hashlin->split) {
    uVar8 = hashlin->bucket_mask & hash;
  }
  uVar3 = 0x1f;
  if ((uVar8 | 1) != 0) {
    for (; (uVar8 | 1) >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  ptVar10 = (tommy_hashlin_node *)(hashlin->bucket[uVar3] + uVar8);
  do {
    do {
      ptVar10 = ptVar10->next;
      if (ptVar10 == (tommy_hashlin_node *)0x0) goto LAB_00104851;
    } while ((((ptVar10->key != hash) ||
              (puVar2 = (uint32_t *)ptVar10->data, pfx_record->asn != *puVar2)) ||
             (pfx_record->max_len != *(uint8_t *)((long)puVar2 + 0x19))) ||
            (pfx_record->min_len != (uint8_t)puVar2[6]));
    local_68 = (pfx_record->prefix).u.addr6.addr[3];
    uVar4 = *(undefined8 *)((long)&(pfx_record->prefix).u + 4);
    local_78 = (uint32_t)*(undefined8 *)&pfx_record->prefix;
    uStack_74 = (undefined4)((ulong)*(undefined8 *)&pfx_record->prefix >> 0x20);
    uStack_70 = (undefined4)uVar4;
    uStack_6c = (undefined4)((ulong)uVar4 >> 0x20);
    local_48 = puVar2[5];
    local_58 = *(undefined8 *)(puVar2 + 1);
    uStack_50 = *(undefined8 *)(puVar2 + 3);
    cVar7 = lrtr_ip_addr_equal();
  } while (cVar7 == '\0');
  if (ptVar10->data == (void *)0x0) {
LAB_00104851:
    data_00 = (undefined8 *)malloc(0x48);
    uVar4 = *(undefined8 *)&(pfx_record->prefix).u;
    uVar5 = *(undefined8 *)((long)&(pfx_record->prefix).u + 8);
    uVar6 = *(undefined8 *)&pfx_record->min_len;
    *data_00 = *(undefined8 *)pfx_record;
    data_00[1] = uVar4;
    data_00[2] = uVar5;
    data_00[3] = uVar6;
    data_00[4] = pfx_record->socket;
    tommy_hashlin_insert(hashlin,(tommy_hashlin_node *)(data_00 + 5),data_00,hash);
    pos = array->count;
    tommy_array_grow(array,pos + 1);
    ppvVar9 = tommy_array_ref(array,pos);
    *ppvVar9 = data_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void pfx_export_cb(const struct pfx_record *pfx_record, void *data)
{
	struct pfx_export_cb_arg *arg = data;
	tommy_array *roa_array = arg->array;
	tommy_hashlin *roa_hashtable = arg->hashtable;

	tommy_hash_t record_hash = hash_pfx_record(pfx_record);

	if (tommy_hashlin_search(roa_hashtable, &pfx_record_cmp, pfx_record, record_hash) != 0)
		return;

	struct pfx_record_entry *pfx_record_entry = malloc(sizeof(struct pfx_record_entry));

	memcpy(&pfx_record_entry->record, pfx_record, sizeof(struct pfx_record));

	tommy_hashlin_insert(roa_hashtable, &pfx_record_entry->hash_node, pfx_record_entry, record_hash);
	tommy_array_insert(roa_array, pfx_record_entry);
}